

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

void __thiscall ODDLParser::OpenDDLParser::pushNode(OpenDDLParser *this,DDLNode *node)

{
  DDLNode *local_8;
  
  if (node != (DDLNode *)0x0) {
    local_8 = node;
    std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::push_back
              (&this->m_stack,&local_8);
  }
  return;
}

Assistant:

void OpenDDLParser::pushNode( DDLNode *node ) {
    if( ddl_nullptr == node ) {
        return;
    }

    m_stack.push_back( node );
}